

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_array(Context *ctx,VariableList *var)

{
  uint uVar1;
  uint uVar2;
  char varname [64];
  
  uVar1 = var->count;
  uVar2 = ctx->uniform_int4_count + ctx->uniform_float4_count + ctx->uniform_bool_count;
  snprintf(varname,0x40,"c_array_%d_%d",(ulong)(uint)var->index,(ulong)uVar1);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s[%d] = { program.local[%d..%d] };",varname,(ulong)uVar1,(ulong)uVar2,
              (ulong)((uVar1 + uVar2) - 1));
  pop_output(ctx);
  var->emit_position = uVar2;
  return;
}

Assistant:

static void emit_ARB1_array(Context *ctx, VariableList *var)
{
    // All uniforms are now packed tightly into the program.local array,
    //  instead of trying to map them to the d3d registers. So this needs to
    //  map to the next piece of the array we haven't used yet. Thankfully,
    //  arb1 lets you make a PARAM array that maps to a subset of another
    //  array; we don't need to do offsets, since myarray[0] can map to
    //  program.local[5] without any extra math from us.
    const int base = var->index;
    const int size = var->count;
    const int arb1base = ctx->uniform_float4_count +
                         ctx->uniform_int4_count +
                         ctx->uniform_bool_count;
    char varname[64];
    get_ARB1_const_array_varname_in_buf(ctx, base, size, varname, sizeof (varname));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s[%d] = { program.local[%d..%d] };", varname,
                size, arb1base, (arb1base + size) - 1);
    pop_output(ctx);
    var->emit_position = arb1base;
}